

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec2d.cpp
# Opt level: O0

Vec2d * __thiscall Vec2d::getOffset(Vec2d *this,Vec2d *offset)

{
  Vec2d *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec2d *offset_local;
  Vec2d *this_local;
  
  this_00 = (Vec2d *)operator_new(8);
  fVar1 = getX(this);
  fVar2 = getX(offset);
  fVar3 = getY(this);
  fVar4 = getY(offset);
  Vec2d(this_00,fVar1 + fVar2,fVar3 + fVar4);
  return this_00;
}

Assistant:

Vec2d* Vec2d::getOffset(Vec2d* offset) {
    return new Vec2d(getX() + offset->getX(), getY() + offset->getY());
}